

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O3

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::handleMetricNode
          (OpenGEXImporter *this,DDLNode *node,aiScene *param_2)

{
  ValueType VVar1;
  DDLNode *pDVar2;
  int iVar3;
  int32 iVar4;
  DDLNode *pDVar5;
  Property *pPVar6;
  Value *this_00;
  char *pcVar7;
  runtime_error *this_01;
  undefined1 *puVar8;
  size_t i;
  long lVar9;
  float fVar10;
  string valName;
  allocator local_71;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if (((node != (DDLNode *)0x0) && (this->m_ctx != (Context *)0x0)) &&
     (pDVar2 = this->m_ctx->m_root, pDVar5 = ODDLParser::DDLNode::getParent(node), pDVar2 == pDVar5)
     ) {
    for (pPVar6 = ODDLParser::DDLNode::getProperties(node); pPVar6 != (Property *)0x0;
        pPVar6 = pPVar6->m_next) {
      if ((pPVar6->m_key != (Text *)0x0) && (pPVar6->m_value->m_type == ddl_string)) {
        std::__cxx11::string::string
                  ((string *)local_50,(char *)pPVar6->m_value->m_data,(allocator *)local_70);
        if (local_50[0] == (undefined1 *)0x0) {
          lVar9 = 0;
LAB_00467b50:
          this_00 = ODDLParser::DDLNode::getValue(node);
          if (this_00 != (Value *)0x0) {
            VVar1 = this_00->m_type;
            if (VVar1 == ddl_int32) {
              iVar4 = ODDLParser::Value::getInt32(this_00);
              this->m_metrics[lVar9].m_intValue = iVar4;
            }
            else if (VVar1 == ddl_string) {
              pcVar7 = ODDLParser::Value::getString(this_00);
              std::__cxx11::string::string((string *)local_70,pcVar7,&local_71);
              std::__cxx11::string::operator=
                        ((string *)(this->m_metrics + lVar9),(string *)local_70);
              if (local_70[0] != local_60) {
                operator_delete(local_70[0]);
              }
            }
            else {
              if (VVar1 != ddl_float) {
                this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
                local_70[0] = local_60;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_70,"OpenGEX: invalid data type for Metric node.","");
                std::runtime_error::runtime_error(this_01,(string *)local_70);
                *(undefined ***)this_01 = &PTR__runtime_error_008dc448;
                __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error)
                ;
              }
              fVar10 = ODDLParser::Value::getFloat(this_00);
              this->m_metrics[lVar9].m_floatValue = fVar10;
            }
          }
        }
        else {
          puVar8 = Grammar::ValidMetricToken_abi_cxx11_;
          lVar9 = 0;
          do {
            iVar3 = std::__cxx11::string::compare(puVar8);
            if (iVar3 == 0) goto LAB_00467b50;
            lVar9 = lVar9 + 1;
            puVar8 = puVar8 + 0x20;
          } while (lVar9 != 4);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
      }
    }
  }
  return;
}

Assistant:

void OpenGEXImporter::handleMetricNode( DDLNode *node, aiScene * /*pScene*/ ) {
    if( nullptr == node || nullptr == m_ctx ) {
        return;
    }

    if( m_ctx->m_root != node->getParent() ) {
        return;
    }

    Property *prop( node->getProperties() );
    while( nullptr != prop ) {
        if( nullptr != prop->m_key ) {
            if( Value::ddl_string == prop->m_value->m_type ) {
                std::string valName( ( char* ) prop->m_value->m_data );
                int type( Grammar::isValidMetricType( valName.c_str() ) );
                if( Grammar::NoneType != type ) {
                    Value *val( node->getValue() );
                    if( nullptr != val ) {
                        if( Value::ddl_float == val->m_type ) {
                            m_metrics[ type ].m_floatValue = val->getFloat();
                        } else if( Value::ddl_int32 == val->m_type ) {
                            m_metrics[ type ].m_intValue = val->getInt32();
                        } else if( Value::ddl_string == val->m_type ) {
                            m_metrics[type].m_stringValue = std::string( val->getString() );
                        } else {
                            throw DeadlyImportError( "OpenGEX: invalid data type for Metric node." );
                        }
                    }
                }
            }
        }
        prop = prop->m_next;
    }
}